

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ucum.cpp
# Opt level: O2

void __thiscall UCUMConversions_convert1_Test::TestBody(UCUMConversions_convert1_Test *this)

{
  XMLElement *pXVar1;
  XMLAttribute *pXVar2;
  char *pcVar3;
  ostream *poVar4;
  char *message;
  char *in_R9;
  double val;
  double val2;
  char *in_stack_fffffffffffffbc8;
  AssertHelper in_stack_fffffffffffffbd8;
  AssertionResult gtest_ar_;
  AssertHelper in_stack_fffffffffffffbf8;
  int failConvert;
  AssertionResult gtest_ar;
  string unitToString;
  string unitFromString;
  precise_unit toUnit;
  precise_unit fromUnit;
  string local_378;
  string local_358;
  XMLDocument doc;
  
  tinyxml2::XMLDocument::XMLDocument(&doc,true,PRESERVE_WHITESPACE);
  tinyxml2::XMLDocument::LoadFile
            (&doc,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/UcumFunctionalTests.xml"
            );
  pXVar1 = tinyxml2::XMLNode::FirstChildElement(&doc.super_XMLNode,"ucumTests");
  pXVar1 = tinyxml2::XMLNode::FirstChildElement(&pXVar1->super_XMLNode,"conversion");
  pXVar1 = tinyxml2::XMLNode::FirstChildElement(&pXVar1->super_XMLNode,"case");
  failConvert = 0;
  while (pXVar1 != (XMLElement *)0x0) {
    pXVar2 = tinyxml2::XMLElement::FindAttribute(pXVar1,"srcUnit");
    pcVar3 = tinyxml2::XMLAttribute::Value(pXVar2);
    std::__cxx11::string::string((string *)&unitFromString,pcVar3,(allocator *)&unitToString);
    pXVar2 = tinyxml2::XMLElement::FindAttribute(pXVar1,"dstUnit");
    pcVar3 = tinyxml2::XMLAttribute::Value(pXVar2);
    std::__cxx11::string::string((string *)&unitToString,pcVar3,(allocator *)&gtest_ar);
    pXVar2 = tinyxml2::XMLElement::FindAttribute(pXVar1,"value");
    val = tinyxml2::XMLAttribute::DoubleValue(pXVar2);
    pXVar2 = tinyxml2::XMLElement::FindAttribute(pXVar1,"outcome");
    val2 = tinyxml2::XMLAttribute::DoubleValue(pXVar2);
    std::__cxx11::string::string((string *)&local_358,(string *)&unitFromString);
    fromUnit = units::unit_from_string(&local_358,7);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::string((string *)&local_378,(string *)&unitToString);
    toUnit = units::unit_from_string(&local_378,7);
    std::__cxx11::string::~string((string *)&local_378);
    pcVar3 = (char *)units::convert<units::precise_unit,units::precise_unit>(val,&fromUnit,&toUnit);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = !NAN((double)pcVar3);
    if (NAN((double)pcVar3)) {
      testing::Message::Message((Message *)&stack0xfffffffffffffbd8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"std::isnan(act)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffbf8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_ucum.cpp"
                 ,0x27b,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffbf8,(Message *)&stack0xfffffffffffffbd8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbf8);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (in_stack_fffffffffffffbd8.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)in_stack_fffffffffffffbd8.data_ + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      testing::internal::DoubleNearPredFormat
                (pcVar3,in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbd8.data_,
                 (double)in_stack_fffffffffffffbf8.data_,val2,
                 (double)gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        message = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          message = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffbd8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_ucum.cpp"
                   ,0x27d,message);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffbd8,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbd8);
        if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      if (0.001 < ABS(val2 - (double)pcVar3) / val2) {
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)&unitFromString);
        poVar4 = std::operator<<(poVar4," and ");
        poVar4 = std::operator<<(poVar4,(string *)&unitToString);
        std::operator<<(poVar4," do not convert ");
        poVar4 = std::ostream::_M_insert<double>((double)pcVar3);
        std::operator<<(poVar4," and expected=");
        poVar4 = std::ostream::_M_insert<double>(val2);
        std::operator<<(poVar4,'\n');
      }
    }
    pXVar1 = tinyxml2::XMLNode::NextSiblingElement(&pXVar1->super_XMLNode,"case");
    std::__cxx11::string::~string((string *)&unitToString);
    std::__cxx11::string::~string((string *)&unitFromString);
  }
  unitToString._M_dataplus._M_p._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&unitFromString,"failConvert","0",&failConvert,(int *)&unitToString);
  if ((char)unitFromString._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&unitToString);
    if (unitFromString._M_string_length == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)unitFromString._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_ucum.cpp",
               0x287,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&unitToString);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if ((long *)CONCAT44(unitToString._M_dataplus._M_p._4_4_,unitToString._M_dataplus._M_p._0_4_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(unitToString._M_dataplus._M_p._4_4_,
                                     unitToString._M_dataplus._M_p._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&unitFromString._M_string_length);
  tinyxml2::XMLDocument::~XMLDocument(&doc);
  return;
}

Assistant:

TEST(UCUMConversions, convert1)
{
    tinyxml2::XMLDocument doc;
    doc.LoadFile(TEST_FILE_FOLDER "/UcumFunctionalTests.xml");

    auto cs = doc.FirstChildElement("ucumTests")
                  ->FirstChildElement("conversion")
                  ->FirstChildElement("case");
    int failConvert = 0;
    while (cs != nullptr) {
        std::string unitFromString = cs->FindAttribute("srcUnit")->Value();
        std::string unitToString = cs->FindAttribute("dstUnit")->Value();
        double value = cs->FindAttribute("value")->DoubleValue();
        double outcome = cs->FindAttribute("outcome")->DoubleValue();
        // std::string id = cs->FindAttribute("id")->Value();
        auto fromUnit =
            units::unit_from_string(unitFromString, units::strict_ucum);
        auto toUnit = units::unit_from_string(unitToString, units::strict_ucum);

        double act = units::convert(value, fromUnit, toUnit);
        EXPECT_FALSE(std::isnan(act));
        if (!std::isnan(act)) {
            EXPECT_NEAR(outcome, act, 0.001 * outcome);
            if (std::fabs(outcome - act) / outcome > 0.001) {
                std::cout << unitFromString << " and " << unitToString
                          << " do not convert " << act
                          << " and expected=" << outcome << '\n';
            }
        }

        cs = cs->NextSiblingElement("case");
    }
    EXPECT_EQ(failConvert, 0);
}